

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
SetupBackgroundSweep
          (HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *this,
          RecyclerSweep *recyclerSweep)

{
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  FreeObject *pFVar5;
  undefined4 *puVar6;
  SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *this_00;
  
  this_00 = &this->allocatorHead;
  while ((this_00->heapBlock == (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0 &&
         (pFVar5 = SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
                   ::GetExplicitFreeList(this_00), pFVar5 == (FreeObject *)0x0))) {
    this_00 = this_00->next;
    if (this_00 == &this->allocatorHead) {
LAB_006c2de2:
      pSVar1 = this->nextAllocableBlockHead;
      uVar4 = HeapBucket::GetBucketIndex(&this->super_HeapBucket);
      (recyclerSweep->normalData).bucketData[uVar4].savedNextAllocableBlockHead = pSVar1;
      uVar4 = HeapBucket::GetBucketIndex(&this->super_HeapBucket);
      if ((recyclerSweep->normalData).bucketData[uVar4].pendingSweepList !=
          (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                           ,0x65a,"(recyclerSweep.GetPendingSweepBlockList(this) == nullptr)",
                           "recyclerSweep.GetPendingSweepBlockList(this) == nullptr");
        if (!bVar3) {
LAB_006c2e76:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      StopAllocationBeforeSweep(this);
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar6 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                     ,0x657,"(this->AllocatorsAreEmpty())","this->AllocatorsAreEmpty()");
  if (!bVar3) goto LAB_006c2e76;
  *puVar6 = 0;
  goto LAB_006c2de2;
}

Assistant:

void
HeapBucketT<TBlockType>::SetupBackgroundSweep(RecyclerSweep& recyclerSweep)
{
    // Don't allocate from existing block temporary when concurrent sweeping

    // Currently Rescan clear allocators, if we remove the uncollectedAllocBytes there, we can
    // avoid it there and do it here.
    Assert(this->AllocatorsAreEmpty());

    DebugOnly(recyclerSweep.SaveNextAllocableBlockHead(this));
    Assert(recyclerSweep.GetPendingSweepBlockList(this) == nullptr);

    this->StopAllocationBeforeSweep();
}